

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_decompress_safe_partial
              (char *src,char *dst,int compressedSize,int targetOutputSize,int dstCapacity)

{
  ushort *puVar1;
  ushort *puVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte bVar5;
  undefined8 uVar6;
  ushort uVar7;
  ushort uVar8;
  U32 length;
  uint uVar9;
  uint uVar10;
  int iVar11;
  char cVar12;
  ushort *puVar13;
  ulong uVar14;
  byte *pbVar15;
  ulong uVar16;
  byte *pbVar17;
  long lVar18;
  ulong uVar19;
  byte *pbVar20;
  byte *in_R10;
  BYTE *e;
  BYTE *d_1;
  size_t __n;
  BYTE *s_1;
  ushort *puVar21;
  ushort *puStack_80;
  int local_50;
  
  if (targetOutputSize < dstCapacity) {
    dstCapacity = targetOutputSize;
  }
  puVar21 = (ushort *)0xffffffffffffffff;
  if (src != (char *)0x0) {
    if (dstCapacity == 0) {
      puVar21 = (ushort *)0x0;
    }
    else if (compressedSize != 0) {
      puVar2 = (ushort *)(src + compressedSize);
      pbVar3 = (byte *)(dst + dstCapacity);
      pbVar15 = (byte *)dst;
      puVar13 = (ushort *)src;
      if (dstCapacity < 0x40) goto LAB_001042d2;
      puVar1 = (ushort *)((long)puVar2 - 0xf);
LAB_00103cd3:
      pbVar20 = pbVar15;
      bVar5 = (byte)*puVar13;
      uVar10 = (uint)bVar5;
      puVar21 = (ushort *)((long)puVar13 + 1);
      uVar19 = (ulong)(uint)(bVar5 >> 4);
      if (bVar5 >> 4 == 0xf) {
        uVar19 = 0xf;
        puVar13 = puVar21;
        if (puVar21 < puVar1) {
          uVar9 = 0;
          do {
            uVar7 = *puVar13;
            puVar13 = (ushort *)((long)puVar13 + 1);
            uVar9 = uVar9 + (byte)uVar7;
          } while (puVar13 < puVar1 && (byte)uVar7 == 0xff);
          uVar19 = (ulong)uVar9 + 0xf;
        }
        pbVar15 = pbVar20 + uVar19;
        if (((puVar1 <= puVar21) || (CARRY8((ulong)pbVar20,uVar19))) ||
           (CARRY8((ulong)puVar13,uVar19))) {
          iVar11 = 5;
        }
        else {
          in_R10 = pbVar15;
          if ((pbVar3 + -0x20 < pbVar15) || (puVar2 + -0x10 < (ushort *)((long)puVar13 + uVar19))) {
            iVar11 = 6;
          }
          else {
            lVar18 = 0;
            do {
              uVar6 = *(undefined8 *)((byte *)((long)puVar13 + lVar18) + 8);
              pbVar17 = pbVar20 + lVar18;
              *(undefined8 *)pbVar17 = *(undefined8 *)((long)puVar13 + lVar18);
              *(undefined8 *)(pbVar17 + 8) = uVar6;
              pbVar4 = (byte *)((long)puVar13 + lVar18 + 0x10);
              uVar6 = *(undefined8 *)(pbVar4 + 8);
              *(undefined8 *)(pbVar17 + 0x10) = *(undefined8 *)pbVar4;
              *(undefined8 *)(pbVar17 + 0x18) = uVar6;
              lVar18 = lVar18 + 0x20;
            } while (pbVar17 + 0x20 < pbVar15);
            iVar11 = 0;
            puVar13 = (ushort *)((long)puVar13 + uVar19);
            pbVar20 = pbVar15;
          }
        }
        puVar21 = puVar13;
        if (iVar11 != 0) {
          if (iVar11 != 5) {
            if (iVar11 == 6) goto LAB_00104120;
            goto LAB_001042f6;
          }
          goto LAB_001042e3;
        }
      }
      else {
        in_R10 = pbVar20 + uVar19;
        if ((ushort *)((long)puVar2 - 0x11U) < puVar21) goto LAB_00104120;
        uVar6 = *(undefined8 *)((long)puVar13 + 9);
        *(undefined8 *)pbVar20 = *(undefined8 *)puVar21;
        *(undefined8 *)(pbVar20 + 8) = uVar6;
        puVar21 = (ushort *)(uVar19 + (long)puVar21);
        pbVar20 = in_R10;
      }
      uVar7 = *puVar21;
      uVar14 = (ulong)uVar7;
      puVar13 = puVar21 + 1;
      pbVar17 = pbVar20 + -uVar14;
      uVar19 = (ulong)(bVar5 & 0xf);
      if (uVar19 == 0xf) {
        if (pbVar17 < dst) {
          iVar11 = 5;
          puStack_80 = (ushort *)0xf;
        }
        else {
          uVar10 = 0;
          do {
            uVar8 = *puVar13;
            puVar13 = (ushort *)((long)puVar13 + 1);
            uVar10 = uVar10 + (byte)uVar8;
          } while ((byte)uVar8 == 0xff && puVar13 < puVar2 + -2);
          puVar21 = (ushort *)(ulong)uVar10;
          if ((puVar2 + -2 <= puVar13) || (CARRY8((ulong)pbVar20,(long)puVar21 + 0xfU))) {
            iVar11 = 5;
            puStack_80 = (ushort *)((long)puVar21 + 0xfU);
          }
          else {
            pbVar15 = pbVar20 + (long)puVar21;
            puVar21 = (ushort *)((long)puVar21 + 0x13);
            iVar11 = 7;
            puStack_80 = puVar21;
            if (pbVar15 + 0x13 < pbVar3 + -0x40) {
              iVar11 = 0;
            }
          }
        }
        if (iVar11 != 0) {
          if (iVar11 != 5) {
            if (iVar11 != 7) goto LAB_001042f6;
            goto LAB_00104233;
          }
          goto LAB_001042e3;
        }
      }
      else {
        puStack_80 = (ushort *)(uVar19 + 4);
        if (pbVar3 + -0x40 <= pbVar20 + uVar19 + 4) goto LAB_00104233;
        if ((dst <= pbVar17) && (7 < uVar7)) {
          *(undefined8 *)pbVar20 = *(undefined8 *)pbVar17;
          *(undefined8 *)(pbVar20 + 8) = *(undefined8 *)(pbVar17 + 8);
          *(undefined2 *)(pbVar20 + 0x10) = *(undefined2 *)(pbVar17 + 0x10);
          pbVar15 = pbVar20 + uVar19 + 4;
          goto LAB_00103cd3;
        }
      }
      if (pbVar17 < dst) goto LAB_001042e3;
      in_R10 = pbVar20 + (long)puStack_80;
      pbVar15 = in_R10;
      if (uVar7 < 0x10) {
        if (uVar14 == 4) {
          iVar11 = *(int *)pbVar17;
LAB_00103ee8:
          *(int *)pbVar20 = iVar11;
          *(int *)(pbVar20 + 4) = iVar11;
          if ((ushort *)0x8 < puStack_80) {
            pbVar20 = pbVar20 + 8;
            do {
              *(int *)pbVar20 = iVar11;
              *(int *)(pbVar20 + 4) = iVar11;
              pbVar20 = pbVar20 + 8;
            } while (pbVar20 < in_R10);
          }
        }
        else {
          if (uVar7 == 2) {
            iVar11 = CONCAT22(*(undefined2 *)pbVar17,*(undefined2 *)pbVar17);
            goto LAB_00103ee8;
          }
          if (uVar7 == 1) {
            iVar11 = (uint)*pbVar17 * 0x1010101;
            goto LAB_00103ee8;
          }
          if (uVar7 < 8) {
            pbVar20[0] = 0;
            pbVar20[1] = 0;
            pbVar20[2] = 0;
            pbVar20[3] = 0;
            *pbVar20 = *pbVar17;
            pbVar20[1] = pbVar17[1];
            pbVar20[2] = pbVar17[2];
            pbVar20[3] = pbVar17[3];
            uVar10 = inc32table[uVar7];
            *(undefined4 *)(pbVar20 + 4) = *(undefined4 *)(pbVar17 + uVar10);
            pbVar17 = pbVar17 + ((ulong)uVar10 - (long)dec64table[uVar7]);
          }
          else {
            *(undefined8 *)pbVar20 = *(undefined8 *)pbVar17;
            pbVar17 = pbVar17 + 8;
          }
          pbVar20 = pbVar20 + 8;
          do {
            *(undefined8 *)pbVar20 = *(undefined8 *)pbVar17;
            pbVar20 = pbVar20 + 8;
            pbVar17 = pbVar17 + 8;
          } while (pbVar20 < in_R10);
        }
      }
      else {
        do {
          uVar6 = *(undefined8 *)(pbVar20 + -uVar14 + 8);
          *(undefined8 *)pbVar20 = *(undefined8 *)(pbVar20 + -uVar14);
          *(undefined8 *)(pbVar20 + 8) = uVar6;
          uVar6 = *(undefined8 *)(pbVar20 + -uVar14 + 0x10 + 8);
          *(undefined8 *)(pbVar20 + 0x10) = *(undefined8 *)(pbVar20 + -uVar14 + 0x10);
          *(undefined8 *)(pbVar20 + 0x18) = uVar6;
          pbVar20 = pbVar20 + 0x20;
        } while (pbVar20 < in_R10);
      }
      goto LAB_00103cd3;
    }
  }
LAB_001042f6:
  return (int)puVar21;
LAB_00104233:
  if (pbVar17 < dst) goto LAB_001042e3;
  pbVar15 = pbVar20 + (long)puStack_80;
  if (pbVar3 + -0xc < pbVar15) {
    puVar21 = (ushort *)(pbVar3 + -(long)pbVar20);
    if (puStack_80 < pbVar3 + -(long)pbVar20) {
      puVar21 = puStack_80;
    }
    in_R10 = pbVar20 + (long)puVar21;
    if (pbVar20 < pbVar17 + (long)puVar21) {
      if (0 < (long)puVar21) {
        do {
          bVar5 = *pbVar17;
          pbVar17 = pbVar17 + 1;
          *pbVar20 = bVar5;
          pbVar20 = pbVar20 + 1;
        } while (pbVar20 < in_R10);
      }
    }
    else {
      memcpy(pbVar20,pbVar17,(size_t)puVar21);
    }
    pbVar15 = in_R10;
    if (in_R10 != pbVar3) goto LAB_001042d2;
LAB_001042f0:
    puVar21 = (ushort *)(ulong)(uint)((int)in_R10 - (int)dst);
    goto LAB_001042f6;
  }
  if ((uint)uVar14 < 8) {
    pbVar20[0] = 0;
    pbVar20[1] = 0;
    pbVar20[2] = 0;
    pbVar20[3] = 0;
    *pbVar20 = *pbVar17;
    pbVar20[1] = pbVar17[1];
    pbVar20[2] = pbVar17[2];
    pbVar20[3] = pbVar17[3];
    uVar14 = (ulong)((uint)uVar14 << 2);
    uVar19 = (ulong)*(uint *)((long)inc32table + uVar14);
    *(undefined4 *)(pbVar20 + 4) = *(undefined4 *)(pbVar17 + uVar19);
    pbVar17 = pbVar17 + (uVar19 - (long)*(int *)((long)dec64table + uVar14));
  }
  else {
    *(undefined8 *)pbVar20 = *(undefined8 *)pbVar17;
    pbVar17 = pbVar17 + 8;
  }
  *(undefined8 *)(pbVar20 + 8) = *(undefined8 *)pbVar17;
  if ((ushort *)0x10 < puStack_80) {
    pbVar20 = pbVar20 + 0x10;
    do {
      pbVar17 = pbVar17 + 8;
      *(undefined8 *)pbVar20 = *(undefined8 *)pbVar17;
      pbVar20 = pbVar20 + 8;
    } while (pbVar20 < pbVar15);
  }
LAB_001042d2:
  pbVar20 = pbVar15;
  bVar5 = (byte)*puVar13;
  puVar21 = (ushort *)((long)puVar13 + 1);
  while( true ) {
    uVar10 = (uint)bVar5;
    if (bVar5 >> 4 == 0xf) break;
    uVar19 = (ulong)(uint)(bVar5 >> 4);
    if ((src + (long)compressedSize + -0x10 <= puVar21) ||
       (dst + (long)dstCapacity + -0x20 < pbVar20)) goto LAB_00104119;
    uVar6 = *(undefined8 *)(puVar21 + 4);
    *(undefined8 *)pbVar20 = *(undefined8 *)puVar21;
    *(undefined8 *)(pbVar20 + 8) = uVar6;
    pbVar20 = pbVar20 + uVar19;
    uVar16 = (ulong)(uVar10 & 0xf);
    puVar13 = (ushort *)((long)puVar21 + uVar19) + 1;
    uVar7 = *(ushort *)((long)puVar21 + uVar19);
    uVar14 = (ulong)uVar7;
    pbVar17 = pbVar20 + -uVar14;
    if ((((uVar10 & 0xf) == 0xf) || (uVar7 < 8)) || (pbVar17 < dst)) goto LAB_001041c8;
    *(undefined8 *)pbVar20 = *(undefined8 *)pbVar17;
    *(undefined8 *)(pbVar20 + 8) = *(undefined8 *)(pbVar17 + 8);
    *(undefined2 *)(pbVar20 + 0x10) = *(undefined2 *)(pbVar17 + 0x10);
    pbVar20 = pbVar20 + uVar16 + 4;
    bVar5 = *(byte *)((long)puVar21 + uVar19 + 2);
    puVar21 = (ushort *)((long)puVar21 + uVar19 + 3);
  }
  puVar1 = (ushort *)((long)puVar2 - 0xf);
  uVar19 = 0xf;
  puVar13 = puVar21;
  if (puVar21 < puVar1) {
    uVar9 = 0;
    do {
      uVar7 = *puVar13;
      puVar13 = (ushort *)((long)puVar13 + 1);
      uVar9 = uVar9 + (byte)uVar7;
    } while (puVar13 < puVar1 && (byte)uVar7 == 0xff);
    uVar19 = (ulong)uVar9 + 0xf;
  }
  if (((puVar1 <= puVar21) || (CARRY8((ulong)pbVar20,uVar19))) ||
     (puVar21 = puVar13, CARRY8((ulong)puVar13,uVar19))) goto LAB_001042e3;
LAB_00104119:
  in_R10 = pbVar20 + uVar19;
LAB_00104120:
  puVar13 = (ushort *)((long)puVar21 + uVar19);
  if ((pbVar3 + -0xc < in_R10) || (puVar2 + -4 < puVar13)) {
    if (puVar2 < puVar13) {
      uVar19 = (long)puVar2 - (long)puVar21;
    }
    pbVar15 = in_R10;
    if (puVar2 < puVar13) {
      pbVar15 = pbVar20 + ((long)puVar2 - (long)puVar21);
    }
    __n = (long)pbVar3 - (long)pbVar20;
    if (pbVar15 <= pbVar3) {
      __n = uVar19;
    }
    memmove(pbVar20,puVar21,__n);
    in_R10 = pbVar20 + __n;
    if ((pbVar3 <= pbVar15) || (puVar13 = (ushort *)((long)puVar21 + __n), puVar2 + -1 <= puVar13))
    goto LAB_001042f0;
  }
  else {
    do {
      *(undefined8 *)pbVar20 = *(undefined8 *)puVar21;
      pbVar20 = pbVar20 + 8;
      puVar21 = puVar21 + 4;
    } while (pbVar20 < in_R10);
  }
  uVar14 = (ulong)*puVar13;
  puVar13 = puVar13 + 1;
  pbVar17 = in_R10 + -uVar14;
  uVar16 = (ulong)(uVar10 & 0xf);
  pbVar20 = in_R10;
LAB_001041c8:
  if ((int)uVar16 == 0xf) {
    uVar10 = 0;
    do {
      uVar7 = *puVar13;
      puVar13 = (ushort *)((long)puVar13 + 1);
      uVar10 = uVar10 + (byte)uVar7;
    } while (puVar13 < puVar2 + -2 && (byte)uVar7 == 0xff);
    uVar16 = (ulong)uVar10 + 0xf;
    cVar12 = '\x05';
    if (puVar13 < puVar2 + -2) {
      cVar12 = CARRY8((ulong)pbVar20,uVar16) * '\x05';
    }
    if (cVar12 != '\0') {
      puVar21 = puVar13;
      if (cVar12 != '\x05') goto LAB_001042f6;
      goto LAB_001042e3;
    }
  }
  puStack_80 = (ushort *)(uVar16 + 4);
  goto LAB_00104233;
LAB_001042e3:
  local_50 = (int)src;
  puVar21 = (ushort *)(ulong)(~(uint)puVar13 + local_50);
  goto LAB_001042f6;
}

Assistant:

LZ4_FORCE_O2
int LZ4_decompress_safe_partial(const char* src, char* dst, int compressedSize, int targetOutputSize, int dstCapacity)
{
    dstCapacity = MIN(targetOutputSize, dstCapacity);
    return LZ4_decompress_generic(src, dst, compressedSize, dstCapacity,
                                  endOnInputSize, partial_decode,
                                  noDict, (BYTE*)dst, NULL, 0);
}